

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_bot.cpp
# Opt level: O2

void InitBotStuff(void)

{
  byte *pbVar1;
  BYTE *pBVar2;
  bool bVar3;
  PClass *ti;
  PClassActor *pPVar4;
  AActor *pAVar5;
  long lVar6;
  
  for (lVar6 = 0x10; lVar6 != 0x370; lVar6 = lVar6 + 0x18) {
    ti = PClass::FindClass(*(char **)((long)&PTR_PostBeginPlay_006eb7d0 + lVar6));
    if (ti != (PClass *)0x0) {
      bVar3 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,ti);
      if ((bVar3) && (pBVar2 = ti->Defaults, pBVar2 != (BYTE *)0x0)) {
        *(double *)(pBVar2 + 0x560) =
             (double)*(int *)((long)&PTR_PostSerialize_006eb7d8 + lVar6) * 1.52587890625e-05;
        *(uint *)(pBVar2 + 0x4fc) =
             *(uint *)(pBVar2 + 0x4fc) | *(uint *)((long)&PTR_PostSerialize_006eb7d8 + lVar6 + 4);
        pPVar4 = PClass::FindActor(*(char **)((long)&InitBotStuff::botinits[0].type + lVar6));
        *(PClassActor **)(pBVar2 + 0x540) = pPVar4;
      }
    }
  }
  for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
    pAVar5 = GetDefaultByName((char *)((long)&_ZZ12InitBotStuffvE15warnbotmissiles_rel +
                                      (long)*(int *)((long)&_ZZ12InitBotStuffvE15warnbotmissiles_rel
                                                    + lVar6)));
    if (pAVar5 != (AActor *)0x0) {
      pbVar1 = (byte *)((long)&(pAVar5->flags3).Value + 3);
      *pbVar1 = *pbVar1 | 0x20;
    }
  }
  return;
}

Assistant:

void InitBotStuff()
{
	static struct BotInit
	{
		const char *type;
		int movecombatdist;
		int weaponflags;
		const char *projectile;
	} botinits[] = {

		{ "Pistol", 25000000, 0, NULL },
		{ "Shotgun", 24000000, 0, NULL },
		{ "SuperShotgun", 15000000, 0, NULL },
		{ "Chaingun", 27000000, 0, NULL },
		{ "RocketLauncher", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "Rocket" },
		{ "PlasmaRifle",  27000000, 0, "PlasmaBall" },
		{ "BFG9000", 10000000, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_BFG, "BFGBall" },
		{ "GoldWand", 25000000, 0, NULL },
		{ "GoldWandPowered", 25000000, 0, NULL },
		{ "Crossbow", 24000000, 0, "CrossbowFX1" },
		{ "CrossbowPowered", 24000000, 0, "CrossbowFX2" },
		{ "Blaster", 27000000, 0, NULL },
		{ "BlasterPowered", 27000000, 0, "BlasterFX1" },
		{ "SkullRod", 27000000, 0, "HornRodFX1" },
		{ "SkullRodPowered", 27000000, 0, "HornRodFX2" },
		{ "PhoenixRod", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "PhoenixFX1" },
		{ "Mace", 27000000, WIF_BOT_REACTION_SKILL_THING, "MaceFX2" },
		{ "MacePowered", 27000000, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "MaceFX4" },
		{ "FWeapHammer", 22000000, 0, "HammerMissile" },
		{ "FWeapQuietus", 20000000, 0, "FSwordMissile" },
		{ "CWeapStaff", 25000000, 0, "CStaffMissile" },
		{ "CWeapFlane", 27000000, 0, "CFlameMissile" },
		{ "MWeapWand", 25000000, 0, "MageWandMissile" },
		{ "CWeapWraithverge", 22000000, 0, "HolyMissile" },
		{ "MWeapFrost", 19000000, 0, "FrostMissile" },
		{ "MWeapLightning", 23000000, 0, "LightningFloor" },
		{ "MWeapBloodscourge", 20000000, 0, "MageStaffFX2" },
		{ "StrifeCrossbow", 24000000, 0, "ElectricBolt" },
		{ "StrifeCrossbow2", 24000000, 0, "PoisonBolt" },
		{ "AssaultGun", 27000000, 0, NULL },
		{ "MiniMissileLauncher", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "MiniMissile" },
		{ "FlameThrower", 24000000, 0, "FlameMissile" },
		{ "Mauler", 15000000, 0, NULL },
		{ "Mauler2", 10000000, 0, "MaulerTorpedo" },
		{ "StrifeGrenadeLauncher", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "HEGrenade" },
		{ "StrifeGrenadeLauncher2", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "PhosphorousGrenade" },
	};

	for(unsigned i=0;i<sizeof(botinits)/sizeof(botinits[0]);i++)
	{
		const PClass *cls = PClass::FindClass(botinits[i].type);
		if (cls != NULL && cls->IsDescendantOf(RUNTIME_CLASS(AWeapon)))
		{
			AWeapon *w = (AWeapon*)GetDefaultByType(cls);
			if (w != NULL)
			{
				w->MoveCombatDist = botinits[i].movecombatdist/65536.;
				w->WeaponFlags |= botinits[i].weaponflags;
				w->ProjectileType = PClass::FindActor(botinits[i].projectile);
			}
		}
	}

	static const char *warnbotmissiles[] = { "PlasmaBall", "Ripper", "HornRodFX1" };
	for(unsigned i=0;i<countof(warnbotmissiles);i++)
	{
		AActor *a = GetDefaultByName (warnbotmissiles[i]);
		if (a != NULL)
		{
			a->flags3|=MF3_WARNBOT;
		}
	}
}